

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

int mbedtls_ecp_check_privkey(mbedtls_ecp_group *grp,mbedtls_mpi *d)

{
  mbedtls_mpi_uint *pmVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  
  pmVar1 = (grp->G).X.p;
  iVar2 = -0x4f80;
  if (pmVar1 != (mbedtls_mpi_uint *)0x0) {
    if ((grp->G).Y.p == (mbedtls_mpi_uint *)0x0) {
      iVar3 = mbedtls_mpi_get_bit(d,0);
      iVar2 = -0x4c80;
      if ((iVar3 == 0) && (iVar3 = mbedtls_mpi_get_bit(d,1), iVar3 == 0)) {
        sVar4 = mbedtls_mpi_bitlen(d);
        if ((sVar4 - 1 == grp->nbits) &&
           ((grp->nbits != 0xfe || (iVar3 = mbedtls_mpi_get_bit(d,2), iVar3 == 0)))) {
          iVar2 = 0;
        }
      }
    }
    else if ((pmVar1 != (mbedtls_mpi_uint *)0x0) && ((grp->G).Y.p != (mbedtls_mpi_uint *)0x0)) {
      iVar2 = mbedtls_mpi_cmp_int(d,1);
      if (iVar2 < 0) {
        iVar2 = -0x4c80;
      }
      else {
        iVar3 = mbedtls_mpi_cmp_mpi(d,&grp->N);
        iVar2 = -0x4c80;
        if (iVar3 < 0) {
          iVar2 = 0;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_ecp_check_privkey( const mbedtls_ecp_group *grp, const mbedtls_mpi *d )
{
#if defined(ECP_MONTGOMERY)
    if( ecp_get_type( grp ) == ECP_TYPE_MONTGOMERY )
    {
        /* see RFC 7748 sec. 5 para. 5 */
        if( mbedtls_mpi_get_bit( d, 0 ) != 0 ||
            mbedtls_mpi_get_bit( d, 1 ) != 0 ||
            mbedtls_mpi_bitlen( d ) - 1 != grp->nbits ) /* mbedtls_mpi_bitlen is one-based! */
            return( MBEDTLS_ERR_ECP_INVALID_KEY );
        else

        /* see [Curve25519] page 5 */
        if( grp->nbits == 254 && mbedtls_mpi_get_bit( d, 2 ) != 0 )
            return( MBEDTLS_ERR_ECP_INVALID_KEY );

        return( 0 );
    }
#endif /* ECP_MONTGOMERY */
#if defined(ECP_SHORTWEIERSTRASS)
    if( ecp_get_type( grp ) == ECP_TYPE_SHORT_WEIERSTRASS )
    {
        /* see SEC1 3.2 */
        if( mbedtls_mpi_cmp_int( d, 1 ) < 0 ||
            mbedtls_mpi_cmp_mpi( d, &grp->N ) >= 0 )
            return( MBEDTLS_ERR_ECP_INVALID_KEY );
        else
            return( 0 );
    }
#endif /* ECP_SHORTWEIERSTRASS */

    return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );
}